

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswConstr.c
# Opt level: O2

int Ssw_ManSetConstrPhases_(Aig_Man_t *p,int nFrames,Vec_Int_t **pvInits)

{
  lit *begin;
  int Entry;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  Vec_Int_t *p_01;
  void *pvVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int i;
  
  if (pvInits != (Vec_Int_t **)0x0) {
    *pvInits = (Vec_Int_t *)0x0;
  }
  if (0 < p->nConstrs) {
    iVar3 = p->nRegs;
    iVar4 = p->nObjs[3];
    p->nRegs = 0;
    p_00 = Cnf_Derive(p,iVar4);
    p->nRegs = iVar3;
    iVar3 = 0;
    s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,nFrames,0);
    if (s->size != p_00->nVars * nFrames) {
      __assert_fail("pSat->size == nFrames * pCnf->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                    ,0xac,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
    }
    p_01 = Vec_IntAlloc(100);
    while( true ) {
      if (p->nRegs <= iVar3) {
        iVar3 = 0;
        if (nFrames < 1) {
          nFrames = 0;
        }
        do {
          if (iVar3 == nFrames) {
            begin = p_01->pArray;
            iVar3 = sat_solver_solve(s,begin,begin + p_01->nSize,1000000,0,0,0);
            if ((pvInits != (Vec_Int_t **)0x0) && (iVar3 == 1)) {
              pVVar2 = Vec_IntAlloc(1000);
              *pvInits = pVVar2;
              for (iVar4 = 0; iVar4 != nFrames; iVar4 = iVar4 + 1) {
                for (i = 0; i < p->nTruePis; i = i + 1) {
                  pvVar1 = Vec_PtrEntry(p->vCis,i);
                  pVVar2 = *pvInits;
                  Entry = sat_solver_var_value
                                    (s,p_00->nVars * iVar4 +
                                       p_00->pVarNums[*(int *)((long)pvVar1 + 0x24)]);
                  Vec_IntPush(pVVar2,Entry);
                }
              }
            }
            sat_solver_delete(s);
            free(begin);
            free(p_01);
            Cnf_DataFree(p_00);
            iVar4 = 1;
            if (iVar3 != -1) {
              iVar4 = -(uint)(iVar3 != 1);
            }
            return iVar4;
          }
          for (iVar4 = 0; iVar4 < p->nTruePos; iVar4 = iVar4 + 1) {
            pvVar1 = Vec_PtrEntry(p->vCos,iVar4);
            if (p->nTruePos - p->nConstrs <= iVar4) {
              if (p_00->pVarNums[*(int *)((long)pvVar1 + 0x24)] < 0) {
                __assert_fail("pCnf->pVarNums[Aig_ObjId(pObj)] >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                              ,0xba,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
              }
              Vec_IntPush(p_01,(p_00->nVars * iVar3 + p_00->pVarNums[*(int *)((long)pvVar1 + 0x24)])
                               * 2 + 1);
            }
          }
          iVar3 = iVar3 + 1;
        } while( true );
      }
      pvVar1 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar3);
      if (p_00->pVarNums[*(int *)((long)pvVar1 + 0x24)] < 0) break;
      Vec_IntPush(p_01,p_00->pVarNums[*(int *)((long)pvVar1 + 0x24)] * 2 + 1);
      iVar3 = iVar3 + 1;
    }
    __assert_fail("pCnf->pVarNums[Aig_ObjId(pObj)] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                  ,0xb1,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
  }
  __assert_fail("p->nConstrs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswConstr.c"
                ,0xa5,"int Ssw_ManSetConstrPhases_(Aig_Man_t *, int, Vec_Int_t **)");
}

Assistant:

int Ssw_ManSetConstrPhases_( Aig_Man_t * p, int nFrames, Vec_Int_t ** pvInits )
{
    Vec_Int_t * vLits;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    Aig_Obj_t * pObj;
    int i, f, iVar, RetValue, nRegs;
    if ( pvInits )
        *pvInits = NULL;
    assert( p->nConstrs > 0 );
    // create CNF
    nRegs = p->nRegs; p->nRegs = 0;
    pCnf = Cnf_Derive( p, Aig_ManCoNum(p) );
    p->nRegs = nRegs;
    // create SAT solver
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, nFrames, 0 );
    assert( pSat->size == nFrames * pCnf->nVars );
    // collect constraint literals
    vLits = Vec_IntAlloc( 100 );
    Saig_ManForEachLo( p, pObj, i )
    {
        assert( pCnf->pVarNums[Aig_ObjId(pObj)] >= 0 );
        Vec_IntPush( vLits, toLitCond(pCnf->pVarNums[Aig_ObjId(pObj)], 1) );
    }
    for ( f = 0; f < nFrames; f++ )
    {
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                continue;
            assert( pCnf->pVarNums[Aig_ObjId(pObj)] >= 0 );
            iVar = pCnf->pVarNums[Aig_ObjId(pObj)] + pCnf->nVars*f;
            Vec_IntPush( vLits, toLitCond(iVar, 1) );
        }
    }
    RetValue = sat_solver_solve( pSat, (int *)Vec_IntArray(vLits),
        (int *)Vec_IntArray(vLits) + Vec_IntSize(vLits),
        (ABC_INT64_T)1000000, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( RetValue == l_True && pvInits )
    {
        *pvInits = Vec_IntAlloc( 1000 );
        for ( f = 0; f < nFrames; f++ )
        {
            Saig_ManForEachPi( p, pObj, i )
            {
                iVar = pCnf->pVarNums[Aig_ObjId(pObj)] + pCnf->nVars*f;
                Vec_IntPush( *pvInits, sat_solver_var_value(pSat, iVar) );
            }
        }
    }
    sat_solver_delete( pSat );
    Vec_IntFree( vLits );
    Cnf_DataFree( pCnf );
    if ( RetValue == l_False )
        return 1;
    if ( RetValue == l_True )
        return 0;
    return -1;
}